

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::ObjCmp(SQVM *this,SQObjectPtr *o1,SQObjectPtr *o2,SQInteger *result)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  SQObjectValue *in_RCX;
  uint *in_RDX;
  uint *in_RSI;
  SQVM *in_RDI;
  SQVM *unaff_retaddr;
  SQObjectPtr closure;
  SQObjectPtr res;
  SQObjectType t2;
  SQObjectType t1;
  undefined2 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8a;
  uint uVar4;
  SQMetaMethod in_stack_ffffffffffffff9c;
  SQObjectPtr *in_stack_ffffffffffffffa0;
  SQVM *in_stack_ffffffffffffffa8;
  SQObjectPtr local_40;
  uint local_30;
  uint local_2c;
  SQObjectValue *local_28;
  uint *local_20;
  uint *local_18;
  undefined7 in_stack_fffffffffffffff8;
  byte in_stack_ffffffffffffffff;
  
  local_2c = *in_RSI;
  local_30 = *in_RDX;
  if (local_2c != local_30) {
    if (((*in_RSI & 0x4000000) == 0) || ((*in_RDX & 0x4000000) == 0)) {
      if (local_2c == 0x1000001) {
        in_RCX->nInteger = -1;
        in_stack_ffffffffffffffff = 1;
      }
      else if (local_30 == 0x1000001) {
        in_RCX->nInteger = 1;
        in_stack_ffffffffffffffff = 1;
      }
      else {
        Raise_CompareError(unaff_retaddr,
                           (SQObject *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                           ,(SQObject *)in_RDI);
        in_stack_ffffffffffffffff = 0;
      }
    }
    else if ((local_2c == 0x5000002) && (local_30 == 0x5000004)) {
      if (((float)*(long *)(in_RSI + 2) != (float)in_RDX[2]) ||
         (NAN((float)*(long *)(in_RSI + 2)) || NAN((float)in_RDX[2]))) {
        if ((float)in_RDX[2] <= (float)*(long *)(in_RSI + 2)) {
          in_RCX->nInteger = 1;
          in_stack_ffffffffffffffff = 1;
        }
        else {
          in_RCX->nInteger = -1;
          in_stack_ffffffffffffffff = 1;
        }
      }
      else {
        in_RCX->pTable = (SQTable *)0x0;
        in_stack_ffffffffffffffff = 1;
      }
    }
    else if (((float)in_RSI[2] != (float)*(long *)(in_RDX + 2)) ||
            (NAN((float)in_RSI[2]) || NAN((float)*(long *)(in_RDX + 2)))) {
      if ((float)*(long *)(in_RDX + 2) <= (float)in_RSI[2]) {
        in_RCX->nInteger = 1;
        in_stack_ffffffffffffffff = 1;
      }
      else {
        in_RCX->nInteger = -1;
        in_stack_ffffffffffffffff = 1;
      }
    }
    else {
      in_RCX->pTable = (SQTable *)0x0;
      in_stack_ffffffffffffffff = 1;
    }
    goto LAB_001313f3;
  }
  if (*(long *)(in_RSI + 2) == *(long *)(in_RDX + 2)) {
    in_RCX->pTable = (SQTable *)0x0;
    in_stack_ffffffffffffffff = 1;
    goto LAB_001313f3;
  }
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  ::SQObjectPtr::SQObjectPtr(&local_40);
  if (local_2c == 0x5000002) {
    iVar3 = 1;
    if (*(long *)(local_18 + 2) < *(long *)(local_20 + 2)) {
      iVar3 = -1;
    }
    *local_28 = (SQObjectValue)(long)iVar3;
    in_stack_ffffffffffffffff = 1;
  }
  else if (local_2c == 0x5000004) {
    iVar3 = 1;
    if ((float)local_18[2] < (float)local_20[2]) {
      iVar3 = -1;
    }
    *local_28 = (SQObjectValue)(long)iVar3;
    in_stack_ffffffffffffffff = 1;
  }
  else if (local_2c == 0x8000010) {
    iVar3 = strcmp((char *)(*(long *)(local_18 + 2) + 0x38),(char *)(*(long *)(local_20 + 2) + 0x38)
                  );
    *local_28 = (SQObjectValue)(long)iVar3;
    in_stack_ffffffffffffffff = 1;
  }
  else {
    if ((((local_2c == 0xa000020) || (local_2c == 0xa000080)) || (local_2c == 0xa008000)) &&
       (*(long *)(*(long *)(local_18 + 2) + 0x30) != 0)) {
      uVar4 = local_2c;
      ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffa8);
      bVar1 = (**(code **)(**(long **)(local_18 + 2) + 0x30))
                        (*(long **)(local_18 + 2),in_RDI,10,&stack0xffffffffffffffa8);
      if ((bVar1 & 1) == 0) {
        bVar2 = false;
      }
      else {
        Push(in_RDI,(SQObjectPtr *)
                    CONCAT44(uVar4,CONCAT13(bVar1,CONCAT12(in_stack_ffffffffffffff8a,
                                                           in_stack_ffffffffffffff88))));
        Push(in_RDI,(SQObjectPtr *)
                    CONCAT44(uVar4,CONCAT13(bVar1,CONCAT12(in_stack_ffffffffffffff8a,
                                                           in_stack_ffffffffffffff88))));
        bVar2 = CallMetaMethod(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                               in_stack_ffffffffffffff9c,(SQInteger)in_RDI,
                               (SQObjectPtr *)
                               CONCAT44(uVar4,CONCAT13(bVar1,CONCAT12(in_stack_ffffffffffffff8a,
                                                                      in_stack_ffffffffffffff88))));
        if (bVar2) {
          if (local_40.super_SQObject._type == OT_INTEGER) {
            *local_28 = local_40.super_SQObject._unVal;
            in_stack_ffffffffffffffff = 1;
            bVar2 = true;
          }
          else {
            Raise_Error(in_RDI,"_cmp must return an integer");
            in_stack_ffffffffffffffff = 0;
            bVar2 = true;
          }
        }
        else {
          in_stack_ffffffffffffffff = 0;
          bVar2 = true;
        }
      }
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
      if (bVar2) goto LAB_00131256;
    }
    iVar3 = 1;
    if (*(ulong *)(local_18 + 2) < *(ulong *)(local_20 + 2)) {
      iVar3 = -1;
    }
    *local_28 = (SQObjectValue)(long)iVar3;
    in_stack_ffffffffffffffff = 1;
  }
LAB_00131256:
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
LAB_001313f3:
  return (bool)(in_stack_ffffffffffffffff & 1);
}

Assistant:

bool SQVM::ObjCmp(const SQObjectPtr &o1,const SQObjectPtr &o2,SQInteger &result)
{
    SQObjectType t1 = sq_type(o1), t2 = sq_type(o2);
    if(t1 == t2) {
        if(_rawval(o1) == _rawval(o2))_RET_SUCCEED(0);
        SQObjectPtr res;
        switch(t1){
        case OT_STRING:
            _RET_SUCCEED(scstrcmp(_stringval(o1),_stringval(o2)));
        case OT_INTEGER:
            _RET_SUCCEED((_integer(o1)<_integer(o2))?-1:1);
        case OT_FLOAT:
            _RET_SUCCEED((_float(o1)<_float(o2))?-1:1);
        case OT_TABLE:
        case OT_USERDATA:
        case OT_INSTANCE:
            if(_delegable(o1)->_delegate) {
                SQObjectPtr closure;
                if(_delegable(o1)->GetMetaMethod(this, MT_CMP, closure)) {
                    Push(o1);Push(o2);
                    if(CallMetaMethod(closure,MT_CMP,2,res)) {
                        if(sq_type(res) != OT_INTEGER) {
                            Raise_Error(_SC("_cmp must return an integer"));
                            return false;
                        }
                        _RET_SUCCEED(_integer(res))
                    }
                    return false;
                }
            }
            //continues through (no break needed)
        default:
            _RET_SUCCEED( _userpointer(o1) < _userpointer(o2)?-1:1 );
        }
        assert(0);
        //if(type(res)!=OT_INTEGER) { Raise_CompareError(o1,o2); return false; }
        //  _RET_SUCCEED(_integer(res));

    }
    else{
        if(sq_isnumeric(o1) && sq_isnumeric(o2)){
            if((t1==OT_INTEGER) && (t2==OT_FLOAT)) {
                if( _integer(o1)==_float(o2) ) { _RET_SUCCEED(0); }
                else if( _integer(o1)<_float(o2) ) { _RET_SUCCEED(-1); }
                _RET_SUCCEED(1);
            }
            else{
                if( _float(o1)==_integer(o2) ) { _RET_SUCCEED(0); }
                else if( _float(o1)<_integer(o2) ) { _RET_SUCCEED(-1); }
                _RET_SUCCEED(1);
            }
        }
        else if(t1==OT_NULL) {_RET_SUCCEED(-1);}
        else if(t2==OT_NULL) {_RET_SUCCEED(1);}
        else { Raise_CompareError(o1,o2); return false; }

    }
    assert(0);
    _RET_SUCCEED(0); //cannot happen
}